

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_replaceRangeCString(AString *str,size_t index,size_t count,char *cstr,size_t len)

{
  bool bVar1;
  size_t reserveSize;
  size_t requiredSize;
  size_t len_local;
  char *cstr_local;
  size_t count_local;
  size_t index_local;
  AString *str_local;
  
  if (str == (AString *)0x0) {
    str_local._4_4_ = false;
  }
  else if ((cstr == (char *)0x0) || (len == 0)) {
    AString_remove(str,index,count);
    str_local._4_4_ = true;
  }
  else if (index < str->size) {
    if ((0xffffffffffffffff - index <= count) ||
       (cstr_local = (char *)count, str->size <= index + count)) {
      cstr_local = (char *)(str->size - index);
    }
    if (len < cstr_local) {
      AString_remove(str,index,(long)cstr_local - len);
    }
    else if (cstr_local < len) {
      reserveSize = str->size + (len - (long)cstr_local);
      bVar1 = AString_reserve(str,reserveSize);
      if (bVar1 == false) {
        return false;
      }
      memmove(str->buffer + len + index,str->buffer + index + (long)cstr_local,
              ((str->size - index) - (long)cstr_local) + 1);
      str->size = reserveSize;
    }
    memcpy(str->buffer + index,cstr,len);
    str_local._4_4_ = true;
  }
  else {
    str_local._4_4_ = AString_appendCString(str,cstr,len);
  }
  return str_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeCString(struct AString *str, size_t index, size_t count, const char *cstr, size_t len)
{
    if(str == nullptr) {
        return false;
    } else if(cstr == nullptr || len == 0) {
        AString_remove(str, index, count);
        return true;
    }
    if(index >= str->size)
        return AString_appendCString(str, cstr, len);
    if(count >= ((size_t) 0) - index - 1 || index + count >= str->size)
        count = str->size - index;
    if(len < count) {
        AString_remove(str, index, count - len);
    } else if(len > count) {
        size_t requiredSize = str->size + (len - count);
        if(!AString_reserve(str, requiredSize))
            return false;
        memmove(str->buffer + index + len, str->buffer + index + count, str->size - index - count + 1);
        str->size = requiredSize;
    }
    memcpy(str->buffer + index, cstr, len * sizeof(char));
    return true;
}